

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O0

void soul::ASTUtilities::resolveHoistedEndpoints(Allocator *allocator,ModuleBase *module)

{
  ModuleBase *pMVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  pool_ref<soul::AST::ModuleBase> *ppVar4;
  ModuleBase *module_00;
  Graph *g;
  pool_ptr<soul::AST::Graph> local_50;
  pool_ptr<soul::AST::Graph> graph;
  pool_ref<soul::AST::ModuleBase> *m;
  pool_ref<soul::AST::ModuleBase> *__end2;
  pool_ref<soul::AST::ModuleBase> *__begin2;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *local_20;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *__range2;
  ModuleBase *module_local;
  Allocator *allocator_local;
  
  __range2 = (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)module;
  module_local = (ModuleBase *)allocator;
  iVar3 = (*(module->super_Scope)._vptr_Scope[0x11])(&module->super_Scope);
  __begin2 = (pool_ref<soul::AST::ModuleBase> *)CONCAT44(extraout_var,iVar3);
  local_20 = (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)&__begin2;
  __end2 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::begin(local_20);
  ppVar4 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::end(local_20);
  for (; pMVar1 = module_local, __end2 != ppVar4; __end2 = __end2 + 1) {
    graph.object = (Graph *)__end2;
    module_00 = pool_ref::operator_cast_to_ModuleBase_((pool_ref *)__end2);
    resolveHoistedEndpoints((Allocator *)pMVar1,module_00);
  }
  cast<soul::AST::Graph,soul::AST::ModuleBase>((soul *)&local_50,(ModuleBase *)__range2);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_50);
  if (bVar2) {
    do {
      pMVar1 = module_local;
      g = pool_ptr<soul::AST::Graph>::operator*(&local_50);
      bVar2 = hoistFirstChildEndpoint((Allocator *)pMVar1,g);
    } while (bVar2);
  }
  pool_ptr<soul::AST::Graph>::~pool_ptr(&local_50);
  return;
}

Assistant:

static void resolveHoistedEndpoints (AST::Allocator& allocator, AST::ModuleBase& module)
    {
        for (auto& m : module.getSubModules())
            resolveHoistedEndpoints (allocator, m);

        if (auto graph = cast<AST::Graph> (module))
        {
            while (hoistFirstChildEndpoint (allocator, *graph))
            {}
        }
    }